

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64
drwav_read_pcm_frames_s16(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  drwav_uint64 dVar4;
  drwav_uint64 dVar5;
  drwav_int16 *pdVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ushort uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  drwav_int16 dVar17;
  ulong uVar18;
  float fVar19;
  double dVar20;
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) {
    dVar4 = 0;
  }
  else {
    if (pBufferOut == (drwav_int16 *)0x0) {
      dVar4 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
      return dVar4;
    }
    dVar4 = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      uVar11 = pWav->bitsPerSample;
      if (uVar11 == 0x10) {
        dVar4 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      }
      else {
        if ((uVar11 & 7) == 0) {
          uVar8 = (uint)(pWav->fmt).channels * (uint)uVar11 >> 3;
        }
        else {
          uVar8 = (uint)(pWav->fmt).blockAlign;
        }
        dVar5 = 0;
        dVar4 = 0;
        if (uVar8 != 0) {
          do {
            uVar7 = 0x1000 / (ulong)uVar8;
            if (framesToRead < 0x1000 / (ulong)uVar8) {
              uVar7 = framesToRead;
            }
            dVar4 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
            if (dVar4 == 0) {
              return dVar5;
            }
            uVar11 = pWav->channels;
            uVar15 = dVar4 * uVar11;
            uVar7 = (ulong)uVar8 / (ulong)uVar11;
            uVar3 = (uint)uVar7;
            switch(uVar3) {
            case 1:
              if (uVar15 != 0) {
                lVar10 = 0;
                do {
                  pBufferOut[lVar10] = (ushort)*(byte *)((long)&local_1038 + lVar10) << 8 ^ 0x8000;
                  lVar10 = lVar10 + 1;
                } while (uVar15 - lVar10 != 0);
              }
              break;
            case 2:
              if (uVar15 != 0) {
                uVar7 = 0;
                do {
                  pBufferOut[uVar7] = *(drwav_int16 *)((long)&local_1038 + uVar7 * 2);
                  uVar7 = uVar7 + 1;
                } while ((uVar7 & 0xffffffff) <= uVar15 && uVar15 - (uVar7 & 0xffffffff) != 0);
              }
              break;
            case 3:
              if (uVar15 != 0) {
                pdVar6 = (drwav_int16 *)((long)&local_1038 + 1);
                lVar10 = 0;
                do {
                  pBufferOut[lVar10] = *pdVar6;
                  lVar10 = lVar10 + 1;
                  pdVar6 = (drwav_int16 *)((long)pdVar6 + 3);
                } while (uVar15 - lVar10 != 0);
              }
              break;
            case 4:
              if (uVar15 != 0) {
                lVar10 = 0;
                do {
                  pBufferOut[lVar10] = *(drwav_int16 *)((long)&local_1038 + lVar10 * 4 + 2);
                  lVar10 = lVar10 + 1;
                } while (uVar15 - lVar10 != 0);
              }
              break;
            default:
              if (uVar3 < 9) {
                if (uVar15 != 0) {
                  uVar14 = 0;
                  puVar16 = &local_1038;
                  pdVar6 = pBufferOut;
                  do {
                    if (uVar8 < uVar11) {
                      dVar17 = 0;
                      uVar13 = 0;
                    }
                    else {
                      uVar13 = 0;
                      uVar18 = 0;
                      iVar9 = uVar3 * -8 + 0x40;
                      do {
                        uVar18 = uVar18 | (ulong)*(byte *)((long)puVar16 + uVar13) <<
                                          ((byte)iVar9 & 0x3f);
                        iVar9 = iVar9 + 8;
                        uVar13 = uVar13 + 1;
                      } while (uVar7 != uVar13);
                      dVar17 = (drwav_int16)(uVar18 >> 0x30);
                      uVar13 = uVar7;
                    }
                    puVar16 = (undefined8 *)((long)puVar16 + uVar13);
                    *pdVar6 = dVar17;
                    pdVar6 = pdVar6 + 1;
                    uVar14 = (ulong)((int)uVar14 + 1);
                  } while (uVar14 <= uVar15 && uVar15 - uVar14 != 0);
                }
              }
              else {
                memset(pBufferOut,0,uVar15 * 2);
              }
            }
            pBufferOut = pBufferOut + pWav->channels * dVar4;
            dVar5 = dVar5 + dVar4;
            framesToRead = framesToRead - dVar4;
            dVar4 = dVar5;
          } while (framesToRead != 0);
        }
      }
      break;
    case 2:
      dVar4 = drwav_read_pcm_frames_s16__msadpcm(pWav,framesToRead,pBufferOut);
      return dVar4;
    case 3:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar8 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar8 = (uint)(pWav->fmt).blockAlign;
      }
      dVar5 = 0;
      dVar4 = 0;
      if (uVar8 != 0) {
        do {
          uVar7 = 0x1000 / (ulong)uVar8;
          if (framesToRead < 0x1000 / (ulong)uVar8) {
            uVar7 = framesToRead;
          }
          dVar4 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
          if (dVar4 == 0) {
            return dVar5;
          }
          lVar10 = dVar4 * pWav->channels;
          uVar3 = uVar8 / pWav->channels;
          if (uVar3 == 8) {
            if (lVar10 != 0) {
              lVar12 = 0;
              do {
                dVar2 = (double)(&local_1038)[lVar12];
                uVar11 = 0x8000;
                if (-1.0 <= dVar2) {
                  dVar20 = 1.0;
                  if (dVar2 <= 1.0) {
                    dVar20 = dVar2;
                  }
                  uVar11 = (ushort)(int)((dVar20 + 1.0) * 32767.5) ^ 0x8000;
                }
                pBufferOut[lVar12] = uVar11;
                lVar12 = lVar12 + 1;
              } while (lVar10 - lVar12 != 0);
            }
          }
          else if (uVar3 == 4) {
            if (lVar10 != 0) {
              lVar12 = 0;
              do {
                fVar1 = *(float *)((long)&local_1038 + lVar12 * 4);
                uVar11 = 0x8000;
                if (-1.0 <= fVar1) {
                  fVar19 = 1.0;
                  if (fVar1 <= 1.0) {
                    fVar19 = fVar1;
                  }
                  uVar11 = (ushort)(int)((fVar19 + 1.0) * 32767.5) ^ 0x8000;
                }
                pBufferOut[lVar12] = uVar11;
                lVar12 = lVar12 + 1;
              } while (lVar10 - lVar12 != 0);
            }
          }
          else {
            memset(pBufferOut,0,lVar10 * 2);
          }
          pBufferOut = pBufferOut + pWav->channels * dVar4;
          dVar5 = dVar5 + dVar4;
          framesToRead = framesToRead - dVar4;
          dVar4 = dVar5;
        } while (framesToRead != 0);
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar8 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar8 = (uint)(pWav->fmt).blockAlign;
      }
      dVar5 = 0;
      dVar4 = 0;
      if (uVar8 != 0) {
        do {
          uVar7 = 0x1000 / (ulong)uVar8;
          if (framesToRead < 0x1000 / (ulong)uVar8) {
            uVar7 = framesToRead;
          }
          dVar4 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
          if (dVar4 == 0) {
            return dVar5;
          }
          lVar10 = pWav->channels * dVar4;
          if (lVar10 == 0) {
            lVar10 = 0;
          }
          else {
            lVar12 = 0;
            do {
              pBufferOut[lVar12] = g_drwavAlawTable[*(byte *)((long)&local_1038 + lVar12)];
              lVar12 = lVar12 + 1;
            } while (lVar10 - lVar12 != 0);
            lVar10 = pWav->channels * dVar4;
          }
          pBufferOut = pBufferOut + lVar10;
          dVar5 = dVar5 + dVar4;
          framesToRead = framesToRead - dVar4;
          dVar4 = dVar5;
        } while (framesToRead != 0);
      }
      break;
    case 7:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar8 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar8 = (uint)(pWav->fmt).blockAlign;
      }
      dVar4 = 0;
      if (uVar8 != 0) {
        do {
          uVar7 = 0x1000 / (ulong)uVar8;
          if (framesToRead < 0x1000 / (ulong)uVar8) {
            uVar7 = framesToRead;
          }
          dVar5 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
          if (dVar5 == 0) {
            return dVar4;
          }
          lVar10 = pWav->channels * dVar5;
          if (lVar10 == 0) {
            lVar10 = 0;
          }
          else {
            lVar12 = 0;
            do {
              pBufferOut[lVar12] = g_drwavMulawTable[*(byte *)((long)&local_1038 + lVar12)];
              lVar12 = lVar12 + 1;
            } while (lVar10 - lVar12 != 0);
            lVar10 = pWav->channels * dVar5;
          }
          pBufferOut = pBufferOut + lVar10;
          dVar4 = dVar4 + dVar5;
          framesToRead = framesToRead - dVar5;
        } while (framesToRead != 0);
      }
      break;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        dVar4 = drwav_read_pcm_frames_s16__ima(pWav,framesToRead,pBufferOut);
        return dVar4;
      }
    }
  }
  return dVar4;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s16(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(drwav_int16) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int16) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}